

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileCollider.cpp
# Opt level: O0

bool __thiscall
solitaire::colliders::StockPileCollider::uncoveredCardsCollidesWith
          (StockPileCollider *this,Position *position)

{
  bool bVar1;
  int extraout_var;
  int extraout_var_00;
  Position local_30;
  Position cardsPosition;
  Position *position_local;
  StockPileCollider *this_local;
  
  cardsPosition.x = (*(this->stockPile->super_Archiver)._vptr_Archiver[7])();
  cardsPosition.y = extraout_var;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&cardsPosition);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_30.x = (*(this->super_StockPileCollider)._vptr_StockPileCollider[5])();
    local_30.y = extraout_var_00;
    this_local._7_1_ = cardCollidesWith(this,&local_30,position);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StockPileCollider::uncoveredCardsCollidesWith(const Position& position) const {
    if (not stockPile.getSelectedCardIndex()) return false;
    const auto cardsPosition = getUncoveredCardsPosition();
    return cardCollidesWith(cardsPosition, position);
}